

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

void __thiscall
cfd::core::MerkleBlock::MerkleBlock
          (MerkleBlock *this,Block *block,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  pointer pTVar1;
  bool bVar2;
  bool bVar3;
  bool __x;
  Txid *target_txid;
  pointer pTVar4;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *__range3;
  pointer pTVar5;
  uint64_t height;
  Txid *txid;
  Txid *txid_00;
  vector<bool,_std::allocator<bool>_> target_indexes;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> txid_list;
  vector<bool,_std::allocator<bool>_> local_a0;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> local_78;
  Txid *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(&local_78,&block->txids_)
  ;
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            (&local_a0,
             (long)local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  local_60 = local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
             super__Vector_impl_data._M_finish;
  txid_00 = local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pTVar4 = (txids->super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (txids->super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      __x = false;
      bVar2 = false;
      if (pTVar4 != pTVar1) {
        do {
          __x = bVar2;
          bVar3 = Txid::Equals(pTVar4,txid_00);
          if (bVar3) {
            __x = true;
          }
          pTVar4 = pTVar4 + 1;
          bVar2 = __x;
        } while (pTVar4 != pTVar1 && !bVar3);
      }
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)&local_a0,__x);
      txid_00 = txid_00 + 1;
    } while (txid_00 != local_60);
  }
  this->transaction_count =
       (long)local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_78.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
             super__Vector_impl_data._M_start >> 5;
  pTVar4 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  pTVar1 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar5 = pTVar4;
  if (pTVar1 != pTVar4) {
    do {
      (**pTVar5->_vptr_Txid)(pTVar5);
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != pTVar1);
    (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar4;
  }
  height = 0xffffffffffffffff;
  do {
    height = height + 1;
  } while (1 < (1L << ((byte)height & 0x3f)) + (this->transaction_count - 1) >>
               ((byte)height & 0x3f));
  ::std::vector<bool,_std::allocator<bool>_>::vector(&local_58,&local_a0);
  TraverseAndBuild(this,height,0,&local_78,&local_58);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector(&local_78);
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

MerkleBlock::MerkleBlock(const Block& block, const std::vector<Txid>& txids) {
  std::vector<bool> target_indexes;
  auto txid_list = block.GetTxids();
  target_indexes.reserve(txid_list.size());
  for (const auto& txid : txid_list) {
    bool is_find = false;
    for (const auto& target_txid : txids) {
      if (target_txid.Equals(txid)) {
        is_find = true;
        break;
      }
    }
    target_indexes.push_back(is_find);
  }

  transaction_count = static_cast<uint64_t>(txid_list.size());
  bits_.clear();
  txids_.clear();

  uint64_t height = 0;
  while (CalcTreeWidth(transaction_count, height) > 1) ++height;

  TraverseAndBuild(height, 0, txid_list, target_indexes);
}